

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  string *__range2;
  long lVar4;
  FilePath *in_RDI;
  FilePath result;
  long *local_78;
  long local_70;
  long local_68 [2];
  FilePath local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  paVar1 = &local_58.pathname_.field_2;
  local_58.pathname_._M_string_length = 0;
  local_58.pathname_.field_2._M_local_buf[0] = '\0';
  local_58.pathname_._M_dataplus._M_p = (pointer)paVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pcVar2 = ((local_38.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,
             pcVar2 + (local_38.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  plVar3 = local_78;
  if (local_70 != 0) {
    lVar4 = 0;
    do {
      if (((*(char *)((long)local_78 + lVar4) != '/') || (plVar3 == local_78)) ||
         (*(char *)((long)plVar3 + -1) != '/')) {
        *(char *)plVar3 = *(char *)((long)local_78 + lVar4);
        plVar3 = (long *)((long)plVar3 + 1);
      }
      lVar4 = lVar4 + 1;
    } while (local_70 != lVar4);
  }
  local_70 = (long)plVar3 - (long)local_78;
  *(char *)plVar3 = '\0';
  std::__cxx11::string::_M_assign((string *)&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  FilePath::RemoveDirectoryName(in_RDI,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.pathname_._M_dataplus._M_p,
                    CONCAT71(local_58.pathname_.field_2._M_allocated_capacity._1_7_,
                             local_58.pathname_.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}